

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(void)

{
  int iVar1;
  runtime_error *prVar2;
  allocator<char> local_919;
  _Any_data local_918;
  code *local_908;
  code *local_900;
  char *errmsg;
  sqlite3 *db;
  _Any_data local_8e8;
  code *local_8d8;
  code *pcStack_8d0;
  string ss;
  _Any_data local_8a0;
  code *local_890;
  code *local_888;
  Template temp;
  server_t s;
  stringstream buf;
  undefined1 local_550 [376];
  Environment env;
  ifstream file;
  streambuf local_218 [504];
  
  db = (sqlite3 *)0x0;
  iVar1 = sqlite3_open("bbs.db",&db);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"can\'t open database");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(&file,"schema.sql",_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&buf);
  std::ostream::operator<<(local_550,local_218);
  std::__cxx11::stringbuf::str();
  errmsg = (char *)0x0;
  iVar1 = sqlite3_exec(db,ss._M_dataplus._M_p,0,0);
  if (iVar1 == 0) {
    inja::Environment::Environment(&env);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"./index.html",(allocator<char> *)local_918._M_pod_data);
    inja::Environment::parse_template(&temp,&env,&s.compiled_tree);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"escape",&local_919);
    local_918._M_unused._M_object = (void *)0x0;
    local_918._8_8_ = 0;
    local_900 = std::
                _Function_handler<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_(std::vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:25:33)>
                ::_M_invoke;
    local_908 = std::
                _Function_handler<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_(std::vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:25:33)>
                ::_M_manager;
    inja::Environment::add_callback(&env,&s.compiled_tree,1,(CallbackFunction *)&local_918);
    std::_Function_base::~_Function_base((_Function_base *)&local_918);
    std::__cxx11::string::~string((string *)&s);
    clask::server_t::server_t(&s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_918._M_pod_data,"/",&local_919);
    local_8d8 = (code *)0x0;
    pcStack_8d0 = (code *)0x0;
    local_8e8._M_unused._M_object = (void *)0x0;
    local_8e8._8_8_ = 0;
    local_8e8._M_unused._M_object = operator_new(0x18);
    *(sqlite3 ***)local_8e8._M_unused._0_8_ = &db;
    *(Environment **)((long)local_8e8._M_unused._0_8_ + 8) = &env;
    *(Template **)((long)local_8e8._M_unused._0_8_ + 0x10) = &temp;
    pcStack_8d0 = std::
                  _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:30:14)>
                  ::_M_invoke;
    local_8d8 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:30:14)>
                ::_M_manager;
    clask::server_t::GET(&s,(string *)&local_918,(functor_response *)&local_8e8);
    std::_Function_base::~_Function_base((_Function_base *)&local_8e8);
    std::__cxx11::string::~string((string *)local_918._M_pod_data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_918._M_pod_data,"/post",&local_919);
    local_8a0._8_8_ = 0;
    local_888 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:49:19)>
                ::_M_invoke;
    local_890 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/sqlite3/main.cxx:49:19)>
                ::_M_manager;
    local_8a0._M_unused._M_object = &db;
    clask::server_t::POST(&s,(string *)&local_918,(functor_response *)&local_8a0);
    std::_Function_base::~_Function_base((_Function_base *)&local_8a0);
    std::__cxx11::string::~string((string *)local_918._M_pod_data);
    clask::server_t::run(&s,0x1f90);
    clask::server_t::~server_t(&s);
    inja::Template::~Template(&temp);
    inja::Environment::~Environment(&env);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::stringstream::~stringstream((stringstream *)&buf);
    std::ifstream::~ifstream(&file);
    return 0;
  }
  std::__cxx11::string::assign((char *)&ss);
  sqlite3_free(errmsg);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&s.compiled_tree,"can\'t execute schema.sql: ",&ss);
  std::runtime_error::runtime_error(prVar2,(string *)&s);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main() {
  sqlite3 *db = nullptr;
  int r = sqlite3_open("bbs.db", &db);
  if (SQLITE_OK != r) {
    throw std::runtime_error("can't open database");
  }
  std::ifstream file("schema.sql");
  std::stringstream buf;
  buf << file.rdbuf();
  std::string ss = buf.str();
  char* errmsg = nullptr;
  r = sqlite3_exec(db, ss.c_str(), nullptr, nullptr, &errmsg);
  if (SQLITE_OK != r) {
    ss = errmsg;
    sqlite3_free(errmsg);
    throw std::runtime_error("can't execute schema.sql: " + ss);
  }

  inja::Environment env;
  inja::Template temp = env.parse_template("./index.html");
  env.add_callback("escape", 1, [](inja::Arguments& args) {
    return clask::html_encode(args.at(0)->get<std::string>());
  });
  auto s = clask::server();

  s.GET("/", [&](clask::request& req) -> clask::response {
    nlohmann::json data;
    auto sql = "select id, text from bbs order by created";
    sqlite3_stmt *stmt = nullptr;
    sqlite3_prepare(db, sql, -1, &stmt, nullptr);
    int n = 0;
    data["posts"] = {};
    while (SQLITE_DONE != sqlite3_step(stmt)) {
      data["posts"][n]["id"] = (std::string) (char*) sqlite3_column_text(stmt, 0);
      data["posts"][n]["text"] = (std::string) (char*) sqlite3_column_text(stmt, 1);
      n++;
    }
    sqlite3_finalize(stmt);
    return clask::response {
      .code = 200,
      .content = env.render(temp, data),
    };
  });

  s.POST("/post", [&](clask::request& req) -> clask::response {
    auto params = clask::params(req.body);
    auto q = params["text"];
    if (q.empty()) {
      return clask::response {
        .code = 400,
        .content = "Bad Request",
      };
    }
    auto sql = "insert into bbs(text) values(?)";
    sqlite3_stmt *stmt = nullptr;
    sqlite3_prepare(db, sql, -1, &stmt, nullptr);
    sqlite3_bind_text(stmt, 1, q.c_str(), -1,
      (sqlite3_destructor_type) SQLITE_TRANSIENT);
    sqlite3_step(stmt);
    sqlite3_finalize(stmt);
    return clask::response {
      .code = 302,
      .headers = {
        { "Location", "/" },
      },
    };
  });

  s.run();
}